

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O2

WitnessVersion
cfd::TransactionContextUtil::CheckSignWithPrivkeySimple
          (OutPoint *outpoint,Pubkey *pubkey,Privkey *privkey,AddressType address_type)

{
  char cVar1;
  WitnessVersion WVar2;
  CfdException *pCVar3;
  allocator local_41;
  undefined1 local_40 [32];
  
  cVar1 = cfd::core::OutPoint::IsValid();
  if (cVar1 == '\0') {
    local_40._0_8_ = "cfd_transaction_internal.cpp";
    local_40._8_4_ = 0x3f;
    local_40._16_8_ = "CheckSignWithPrivkeySimple";
    core::logger::warn<>
              ((CfdSourceLocation *)local_40,"Failed to SignWithPrivkeySimple. Invalid outpoint.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)local_40,"Invalid outpoint.",&local_41);
    core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_40);
    __cxa_throw(pCVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cVar1 = cfd::core::Pubkey::IsValid();
  if (cVar1 != '\0') {
    cVar1 = cfd::core::Privkey::IsInvalid();
    if (cVar1 == '\0') {
      if (address_type - kP2wshAddress < 5) {
        WVar2 = *(WitnessVersion *)(&DAT_0027e3f8 + (ulong)(address_type - kP2wshAddress) * 4);
      }
      else {
        WVar2 = kVersionNone;
      }
      return WVar2;
    }
    local_40._0_8_ = "cfd_transaction_internal.cpp";
    local_40._8_4_ = 0x48;
    local_40._16_8_ = "CheckSignWithPrivkeySimple";
    core::logger::warn<>
              ((CfdSourceLocation *)local_40,"Failed to SignWithPrivkeySimple. Invalid privkey.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)local_40,"Invalid privkey.",&local_41);
    core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_40);
    __cxa_throw(pCVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_40._0_8_ = "cfd_transaction_internal.cpp";
  local_40._8_4_ = 0x44;
  local_40._16_8_ = "CheckSignWithPrivkeySimple";
  core::logger::warn<>
            ((CfdSourceLocation *)local_40,"Failed to SignWithPrivkeySimple. Invalid pubkey.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)local_40,"Invalid pubkey.",&local_41);
  core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_40);
  __cxa_throw(pCVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

WitnessVersion TransactionContextUtil::CheckSignWithPrivkeySimple(
    const OutPoint& outpoint, const Pubkey& pubkey, const Privkey& privkey,
    AddressType address_type) {
  if (!outpoint.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to SignWithPrivkeySimple. Invalid outpoint.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid outpoint.");
  }
  if (!pubkey.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to SignWithPrivkeySimple. Invalid pubkey.");
    throw CfdException(CfdError::kCfdIllegalArgumentError, "Invalid pubkey.");
  }
  if (privkey.IsInvalid()) {
    warn(CFD_LOG_SOURCE, "Failed to SignWithPrivkeySimple. Invalid privkey.");
    throw CfdException(CfdError::kCfdIllegalArgumentError, "Invalid privkey.");
  }

  WitnessVersion version = WitnessVersion::kVersionNone;
  switch (address_type) {
    case AddressType::kP2wshAddress:
    case AddressType::kP2shP2wshAddress:
    case AddressType::kP2wpkhAddress:
    case AddressType::kP2shP2wpkhAddress:
      version = WitnessVersion::kVersion0;
      break;
    case AddressType::kTaprootAddress:
      version = WitnessVersion::kVersion1;
      break;
    default:
      break;
  }
  return version;
}